

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

void __thiscall
google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::clear
          (Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *this)

{
  iterator first;
  undefined8 in_RDI;
  size_type unaff_retaddr;
  InnerIt in_stack_00000008;
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *in_stack_ffffffffffffffb0;
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *in_stack_ffffffffffffffe0;
  undefined8 in_stack_fffffffffffffff0;
  
  begin(in_stack_ffffffffffffffb0);
  end(in_stack_ffffffffffffffb0);
  first.it_.m_ = (InnerMap *)in_RDI;
  first.it_.node_ = (Node *)in_stack_fffffffffffffff0;
  first.it_.bucket_index_ = unaff_retaddr;
  erase(in_stack_ffffffffffffffe0,first,(iterator)in_stack_00000008);
  return;
}

Assistant:

void clear() { erase(begin(), end()); }